

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImGuiWindow *pIVar1;
  ImGuiNavLayer in_EDI;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_00000010;
  ImGuiContext *rect_rel;
  
  rect_rel = GImGui;
  GImGui->NavLayer = in_EDI;
  if (in_EDI == ImGuiNavLayer_Main) {
    pIVar1 = ImGui::NavRestoreLastChildNavWindow(rect_rel->NavWindow);
    rect_rel->NavWindow = pIVar1;
  }
  if ((in_EDI == ImGuiNavLayer_Main) && (rect_rel->NavWindow->NavLastIds[0] != 0)) {
    ImGui::SetNavIDWithRectRel(window._4_4_,(int)window,0,(ImRect *)rect_rel);
  }
  else {
    ImGui::NavInitWindow((ImGuiWindow *)CONCAT44(layer,in_stack_00000010),g._7_1_);
  }
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (layer == 0 && window->NavLastIds[0] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[0], layer, 0, window->NavRectRel[0]);
    else
        ImGui::NavInitWindow(window, true);
}